

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

void PrintBuiltInType(FLispString *out,EZCCBuiltinType type)

{
  char *__s;
  int iVar1;
  size_t len;
  char buf [30];
  char acStack_38 [40];
  
  if (ZCC_UserType < type) {
    iVar1 = mysnprintf(acStack_38,0x1e,"bad-type-%u");
    FLispString::Add(out,acStack_38,(long)iVar1);
    return;
  }
  __s = BuiltInTypeNames[type];
  len = strlen(__s);
  FLispString::Add(out,__s,len);
  return;
}

Assistant:

static void PrintBuiltInType(FLispString &out, EZCCBuiltinType type)
{
	assert(ZCC_NUM_BUILT_IN_TYPES == countof(BuiltInTypeNames));
	if (unsigned(type) >= unsigned(ZCC_NUM_BUILT_IN_TYPES))
	{
		char buf[30];
		size_t len = mysnprintf(buf, countof(buf), "bad-type-%u", type);
		out.Add(buf, len);
	}
	else
	{
		out.Add(BuiltInTypeNames[type]);
	}
}